

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_ifspecific.c
# Opt level: O3

void write_packet(rfc5444_writer *wr,rfc5444_writer_target *iface,void *buffer,size_t length)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar2 = "Interface 2:";
  if (iface == &small_if) {
    pcVar2 = "Interface 1:";
  }
  puts(pcVar2);
  if (length != 0) {
    uVar4 = 0;
    do {
      printf("%04zx:",uVar4);
      uVar1 = uVar4;
      uVar3 = uVar4 | 0x1f;
      if (length < (uVar4 | 0x1f)) {
        uVar3 = length;
      }
      for (; uVar1 < uVar3; uVar1 = uVar1 + 1) {
        pcVar2 = "";
        if ((uVar1 & 3) == 0) {
          pcVar2 = " ";
        }
        printf("%s%02x",pcVar2,(ulong)*(byte *)((long)buffer + uVar1));
      }
      putchar(10);
      uVar4 = uVar4 + 0x20;
    } while (uVar4 < length);
  }
  putchar(10);
  return;
}

Assistant:

static void write_packet(struct rfc5444_writer *wr __attribute__ ((unused)),
    struct rfc5444_writer_target *iface,
    void *buffer, size_t length) {
  size_t i, j;
  uint8_t *buf = buffer;

  if (iface == &small_if) {
    printf("Interface 1:\n");
  }
  else {
    printf("Interface 2:\n");
  }

  for (j=0; j<length; j+=32) {
    printf("%04zx:", j);

    for (i=j; i<length && i < j+31; i++) {
      printf("%s%02x", ((i&3) == 0) ? " " : "", (int)(buf[i]));
    }
    printf("\n");
  }
  printf("\n");
}